

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

void __thiscall
CMerkleBlock::CMerkleBlock
          (CMerkleBlock *this,CBlock *block,CBloomFilter *filter,
          set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          *txids)

{
  pointer psVar1;
  size_type sVar2;
  long lVar3;
  CBlockHeader *pCVar4;
  CMerkleBlock *pCVar5;
  Txid *__x;
  long in_FS_OFFSET;
  bool bVar6;
  byte bVar7;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  vector<bool,_std::allocator<bool>_> vMatch;
  CBlockHeader local_88;
  long local_38;
  
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::CBlockHeader(&this->header);
  CPartialMerkleTree::CPartialMerkleTree(&this->txn);
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vMatchedTxn).
  super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CBlock::GetBlockHeader(&local_88,block);
  pCVar4 = &local_88;
  pCVar5 = this;
  for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pCVar5->header).nVersion = pCVar4->nVersion;
    pCVar4 = (CBlockHeader *)((long)pCVar4 + ((ulong)bVar7 * -2 + 1) * 4);
    pCVar5 = (CMerkleBlock *)((long)pCVar5 + (ulong)bVar7 * -8 + 4);
  }
  vMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  vMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  vMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  vHashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vHashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vHashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (&vMatch,(long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(block->vtx).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<uint256,_std::allocator<uint256>_>::reserve
            (&vHashes,(long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(block->vtx).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_88.nVersion = 0;
  do {
    psVar1 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(block->vtx).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)(uint)local_88.nVersion) {
      CPartialMerkleTree::CPartialMerkleTree((CPartialMerkleTree *)&local_88,&vHashes,&vMatch);
      CPartialMerkleTree::operator=(&this->txn,(CPartialMerkleTree *)&local_88);
      CPartialMerkleTree::~CPartialMerkleTree((CPartialMerkleTree *)&local_88);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&vHashes.super__Vector_base<uint256,_std::allocator<uint256>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&vMatch.super__Bvector_base<std::allocator<bool>_>);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    __x = &(psVar1[(uint)local_88.nVersion].
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash;
    if (txids == (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                  *)0x0) {
      if (filter != (CBloomFilter *)0x0) goto LAB_00a7fb61;
LAB_00a7fb9c:
      bVar6 = false;
LAB_00a7fb9e:
      std::vector<bool,_std::allocator<bool>_>::push_back(&vMatch,bVar6);
    }
    else {
      sVar2 = std::
              set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              ::count(txids,__x);
      bVar6 = sVar2 != 0;
      if (filter == (CBloomFilter *)0x0 || bVar6) goto LAB_00a7fb9e;
LAB_00a7fb61:
      bVar6 = CBloomFilter::IsRelevantAndUpdate
                        (filter,(block->vtx).
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(uint)local_88.nVersion].
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
      if (!bVar6) goto LAB_00a7fb9c;
      std::vector<bool,_std::allocator<bool>_>::push_back(&vMatch,true);
      std::vector<std::pair<unsigned_int,uint256>,std::allocator<std::pair<unsigned_int,uint256>>>::
      emplace_back<unsigned_int&,transaction_identifier<false>const&>
                ((vector<std::pair<unsigned_int,uint256>,std::allocator<std::pair<unsigned_int,uint256>>>
                  *)&this->vMatchedTxn,(uint *)&local_88,__x);
    }
    std::vector<uint256,_std::allocator<uint256>_>::push_back(&vHashes,&__x->m_wrapped);
    local_88.nVersion = local_88.nVersion + 1;
  } while( true );
}

Assistant:

CMerkleBlock::CMerkleBlock(const CBlock& block, CBloomFilter* filter, const std::set<Txid>* txids)
{
    header = block.GetBlockHeader();

    std::vector<bool> vMatch;
    std::vector<uint256> vHashes;

    vMatch.reserve(block.vtx.size());
    vHashes.reserve(block.vtx.size());

    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const Txid& hash{block.vtx[i]->GetHash()};
        if (txids && txids->count(hash)) {
            vMatch.push_back(true);
        } else if (filter && filter->IsRelevantAndUpdate(*block.vtx[i])) {
            vMatch.push_back(true);
            vMatchedTxn.emplace_back(i, hash);
        } else {
            vMatch.push_back(false);
        }
        vHashes.push_back(hash);
    }

    txn = CPartialMerkleTree(vHashes, vMatch);
}